

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

string * EnvironmentTypeToStr_abi_cxx11_
                   (string *__return_storage_ptr__,EnvironmentType environmentType)

{
  char *pcVar1;
  char *pcVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  switch(environmentType) {
  case ENV_TYPE_2D:
    pcVar2 = "2d";
    pcVar1 = "";
    break;
  case ENV_TYPE_2DUU:
    pcVar2 = "2duu";
    pcVar1 = "";
    break;
  case ENV_TYPE_XYTHETA:
    pcVar2 = "xytheta";
    pcVar1 = "";
    break;
  case ENV_TYPE_XYTHETAMLEV:
    pcVar2 = "xythetamlev";
    pcVar1 = "";
    break;
  case ENV_TYPE_ROBARM:
    pcVar2 = "robarm";
    pcVar1 = "";
    break;
  default:
    pcVar2 = "invalid";
    pcVar1 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string EnvironmentTypeToStr(EnvironmentType environmentType)
{
    switch (environmentType) {
    case ENV_TYPE_2D:
        return std::string("2d");
    case ENV_TYPE_2DUU:
        return std::string("2duu");
    case ENV_TYPE_XYTHETA:
        return std::string("xytheta");
    case ENV_TYPE_XYTHETAMLEV:
        return std::string("xythetamlev");
    case ENV_TYPE_ROBARM:
        return std::string("robarm");
    default:
        return std::string("invalid");
    }
}